

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

int dup_identities_check(char *id,lys_module *module)

{
  lys_submodule *plVar1;
  lys_module *plVar2;
  long lVar3;
  ulong uVar4;
  
  if (module->ident_size != 0) {
    lVar3 = 0;
    do {
      if (*(char **)(module->ident->padding + lVar3 + -0x1c) == id) {
LAB_00125926:
        ly_vlog(LYE_DUPID,LY_VLOG_NONE,(void *)0x0,"identity",id);
        return 1;
      }
      lVar3 = lVar3 + 0x48;
    } while ((ulong)module->ident_size * 0x48 != lVar3);
  }
  plVar2 = lys_main_module(module);
  if ((ulong)plVar2->inc_size != 0) {
    uVar4 = 0;
    do {
      plVar1 = plVar2->inc[uVar4].submodule;
      if (plVar1 == (lys_submodule *)0x0) {
        return 0;
      }
      if (plVar1->ident_size != 0) {
        lVar3 = 0;
        do {
          if (*(char **)(plVar1->ident->padding + lVar3 + -0x1c) == id) goto LAB_00125926;
          lVar3 = lVar3 + 0x48;
        } while ((ulong)plVar1->ident_size * 0x48 != lVar3);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != plVar2->inc_size);
  }
  return 0;
}

Assistant:

int
dup_identities_check(const char *id, struct lys_module *module)
{
    struct lys_module *mainmod;
    int i;

    if (dup_identity_check(id, module->ident, module->ident_size)) {
        LOGVAL(LYE_DUPID, LY_VLOG_NONE, NULL, "identity", id);
        return EXIT_FAILURE;
    }

    /* check identity in submodules */
    mainmod = lys_main_module(module);
    for (i = 0; i < mainmod->inc_size && mainmod->inc[i].submodule; ++i) {
        if (dup_identity_check(id, mainmod->inc[i].submodule->ident, mainmod->inc[i].submodule->ident_size)) {
            LOGVAL(LYE_DUPID, LY_VLOG_NONE, NULL, "identity", id);
            return EXIT_FAILURE;
        }
    }

    return EXIT_SUCCESS;
}